

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O0

void __thiscall
bgui::ImageAdapter<unsigned_char>::getPixel
          (ImageAdapter<unsigned_char> *this,double *r,double *g,double *b,float x,float y,int ir,
          int ig,int ib)

{
  byte bVar1;
  int iVar2;
  work_t wVar3;
  int iVar4;
  size_type sVar5;
  int *piVar6;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  double dVar7;
  double dVar8;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_00;
  float in_XMM1_Da;
  int in_stack_00000008;
  double f;
  int ds;
  int j;
  undefined8 in_stack_ffffffffffffff80;
  int j_00;
  undefined8 in_stack_ffffffffffffff88;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffff90;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  float local_28;
  float local_24;
  double *local_20;
  double *local_18;
  double *local_10;
  
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_XMM1_Da;
  local_24 = in_XMM0_Da;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar5 = std::
          vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
          ::size((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                  *)(in_RDI + 0x90));
  if (sVar5 == 0) {
    bVar1 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                      (*(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> **)
                        (in_RDI + 0x70),(long)local_24,(long)local_28,local_2c);
    *local_10 = (double)bVar1;
    bVar1 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                      (*(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> **)
                        (in_RDI + 0x70),(long)local_24,(long)local_28,local_30);
    *local_18 = (double)bVar1;
    bVar1 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                      (*(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> **)
                        (in_RDI + 0x70),(long)local_24,(long)local_28,in_stack_00000008);
    *local_20 = (double)bVar1;
  }
  else {
    dVar7 = log(1.0 / *(double *)(in_RDI + 0x48));
    dVar8 = log(2.0);
    local_34 = (int)(dVar7 / dVar8) + -1;
    sVar5 = std::
            vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
            ::size((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                    *)(in_RDI + 0x90));
    local_38 = (int)sVar5 + -1;
    piVar6 = std::min<int>(&local_38,&local_34);
    local_34 = *piVar6;
    iVar2 = 1 << ((char)local_34 + 1U & 0x1f);
    j_00 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    if (local_34 < 0) {
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (in_stack_ffffffffffffff90,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                         ,(float)in_stack_ffffffffffffff88,j_00);
      *local_10 = (double)wVar3;
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (in_stack_ffffffffffffff90,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                         ,(float)in_stack_ffffffffffffff88,j_00);
      *local_18 = (double)wVar3;
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (in_stack_ffffffffffffff90,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                         ,(float)in_stack_ffffffffffffff88,j_00);
      *local_20 = (double)wVar3;
    }
    else {
      std::
      vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ::operator[]((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                    *)(in_RDI + 0x90),(long)local_34);
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (in_stack_ffffffffffffff90,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                         ,(float)in_stack_ffffffffffffff88,j_00);
      *local_10 = (double)wVar3;
      std::
      vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ::operator[]((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                    *)(in_RDI + 0x90),(long)local_34);
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (in_stack_ffffffffffffff90,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                         ,(float)in_stack_ffffffffffffff88,j_00);
      *local_18 = (double)wVar3;
      std::
      vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ::operator[]((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                    *)(in_RDI + 0x90),(long)local_34);
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (in_stack_ffffffffffffff90,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                         ,(float)in_stack_ffffffffffffff88,j_00);
      *local_20 = (double)wVar3;
    }
    if (((-1 < local_34 + 1) &&
        (iVar4 = local_34 + 1,
        sVar5 = std::
                vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                ::size((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                        *)(in_RDI + 0x90)), iVar4 < (int)sVar5)) &&
       (dVar7 = (1.0 / *(double *)(in_RDI + 0x48) - (double)iVar2) / (double)iVar2, 1e-06 < dVar7))
    {
      dVar8 = *local_10;
      std::
      vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ::operator[]((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                    *)(in_RDI + 0x90),(long)(local_34 + 1));
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (in_stack_ffffffffffffff90,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                         ,(float)in_stack_ffffffffffffff88,j_00);
      *local_10 = (1.0 - dVar7) * dVar8 + dVar7 * (double)wVar3;
      dVar8 = *local_18;
      std::
      vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ::operator[]((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                    *)(in_RDI + 0x90),(long)(local_34 + 1));
      iVar2 = (int)((ulong)dVar8 >> 0x20);
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (in_stack_ffffffffffffff90,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                         ,(float)in_stack_ffffffffffffff88,iVar2);
      *local_18 = (1.0 - dVar7) * dVar8 + dVar7 * (double)wVar3;
      this_00 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)(1.0 - dVar7);
      dVar8 = *local_20;
      std::
      vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ::operator[]((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                    *)(in_RDI + 0x90),(long)(local_34 + 1));
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (this_00,(float)((ulong)dVar7 >> 0x20),SUB84(dVar7,0),iVar2);
      *local_20 = (double)this_00 * dVar8 + dVar7 * (double)wVar3;
    }
  }
  return;
}

Assistant:

void getPixel(double &r, double &g, double &b, float x, float y,
                  int ir, int ig, int ib) const
    {
      if (mipmap.size() > 0)
      {
        int j=static_cast<int>(log(1/scale)/log(2))-1;
        j=std::min(static_cast<int>(mipmap.size())-1, j);

        int ds=1<<(j+1);

        if (j < 0)
        {
          r=image->getBilinear(x, y, ir);
          g=image->getBilinear(x, y, ig);
          b=image->getBilinear(x, y, ib);
        }
        else
        {
          r=mipmap[j].getBilinear(x/ds, y/ds, ir);
          g=mipmap[j].getBilinear(x/ds, y/ds, ig);
          b=mipmap[j].getBilinear(x/ds, y/ds, ib);
        }

        if (j+1 >= 0 && j+1 < static_cast<int>(mipmap.size()))
        {
          double f=(1/scale-ds)/ds;

          if (f > 1e-6)
          {
            r=(1-f)*r+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ir);
            g=(1-f)*g+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ig);
            b=(1-f)*b+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ib);
          }
        }

        return;
      }

      r=image->get(static_cast<long>(x), static_cast<long>(y), ir);
      g=image->get(static_cast<long>(x), static_cast<long>(y), ig);
      b=image->get(static_cast<long>(x), static_cast<long>(y), ib);
    }